

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_mgga_inc.c
# Opt level: O1

void work_mgga_exc_unpol(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,
                        double *tau,xc_mgga_out_params *out)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined8 uVar36;
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  double dVar43;
  double local_160;
  double local_158;
  double local_148;
  double local_138;
  
  if (np != 0) {
    sVar6 = 0;
    local_160 = 0.0;
    do {
      if (p->nspin == 2) {
        lVar5 = (long)(p->dim).rho * sVar6;
        dVar8 = rho[lVar5] + rho[lVar5 + 1];
      }
      else {
        dVar8 = rho[(long)(p->dim).rho * sVar6];
      }
      dVar17 = p->dens_threshold;
      if (dVar17 <= dVar8) {
        dVar8 = rho[(long)(p->dim).rho * sVar6];
        if (rho[(long)(p->dim).rho * sVar6] <= dVar17) {
          dVar8 = dVar17;
        }
        dVar9 = p->sigma_threshold * p->sigma_threshold;
        local_158 = sigma[(long)(p->dim).sigma * sVar6];
        if (sigma[(long)(p->dim).sigma * sVar6] <= dVar9) {
          local_158 = dVar9;
        }
        uVar1 = p->info->flags;
        if ((uVar1 >> 0x10 & 1) != 0) {
          local_160 = tau[(long)(p->dim).tau * sVar6];
          if (tau[(long)(p->dim).tau * sVar6] <= p->tau_threshold) {
            local_160 = p->tau_threshold;
          }
          if (((uVar1 >> 0x11 & 1) != 0) && (dVar9 = dVar8 * 8.0 * local_160, dVar9 <= local_158)) {
            local_158 = dVar9;
          }
        }
        pdVar2 = (double *)p->params;
        dVar9 = p->zeta_threshold;
        dVar10 = cbrt(0.3183098861837907);
        dVar11 = dVar10 * 1.4422495703074083 * 2.519842099789747;
        dVar12 = cbrt(dVar9);
        dVar22 = dVar9 * dVar12;
        local_138 = dVar22;
        if (dVar9 < 2.0) {
          local_138 = 2.5198420997897464;
        }
        dVar13 = cbrt(dVar8);
        dVar14 = cbrt(9.0);
        dVar28 = 1.0 / dVar13;
        dVar37 = (dVar14 * dVar14 * dVar10 * dVar10 * p->cam_omega * 1.4422495703074083 * dVar28 *
                 (double)(~-(ulong)(2.0 <= dVar9) & 0x3ff0000000000000 |
                         (ulong)(1.2599210498948732 / dVar12) & -(ulong)(2.0 <= dVar9))) / 18.0;
        dVar14 = 1.35;
        if (dVar37 <= 1.35) {
          dVar14 = dVar37;
        }
        dVar15 = erf((1.0 / dVar14) * 0.5);
        dVar16 = exp((-1.0 / (dVar14 * dVar14)) * 0.25);
        if (1.35 <= dVar37) {
          if (dVar37 <= 1.35) {
            dVar37 = 1.35;
          }
          auVar41._0_8_ = dVar37 * dVar37;
          dVar14 = auVar41._0_8_ * auVar41._0_8_;
          auVar41._8_8_ = dVar14;
          dVar37 = dVar14 * dVar14;
          auVar39 = divpd(_DAT_00f6f930,auVar41);
          auVar40 = divpd(auVar39,_DAT_00f7bb30);
          auVar35._8_8_ = dVar37;
          auVar35._0_8_ = auVar41._0_8_ * dVar14;
          auVar35 = divpd(_DAT_00f6f930,auVar35);
          uVar36 = auVar35._8_8_;
          auVar27._8_8_ = 0x3ff0000000000000;
          auVar27._0_8_ = uVar36;
          auVar39._8_8_ = dVar37 * dVar37;
          auVar39._0_8_ = auVar41._0_8_ * dVar14;
          auVar39 = divpd(auVar27,auVar39);
          auVar26._8_8_ = uVar36;
          auVar26._0_8_ = uVar36;
          auVar27 = divpd(auVar26,auVar41);
          auVar35 = divpd(auVar35,_DAT_00f7bb40);
          auVar27 = divpd(auVar27,_DAT_00f7bb50);
          auVar39 = divpd(auVar39,_DAT_00f7bb60);
          local_148 = ((((((auVar40._0_8_ - auVar40._8_8_) + auVar35._0_8_) - auVar35._8_8_) +
                        auVar27._0_8_) - auVar27._8_8_) + auVar39._0_8_) - auVar39._8_8_;
        }
        else {
          local_148 = dVar14 * -2.6666666666666665 *
                      (dVar15 * 1.7724538509055159 +
                      (dVar16 + -1.5 + (dVar16 + -1.0) * dVar14 * dVar14 * -2.0) * (dVar14 + dVar14)
                      ) + 1.0;
        }
        bVar4 = dVar17 < dVar8 * 0.5;
        dVar15 = dVar8 * dVar8;
        dVar29 = 1.0 / (dVar13 * dVar13);
        dVar16 = local_158 * 1.5874010519681996 * (dVar29 / dVar15);
        dVar30 = (dVar29 / dVar15) * 1.5874010519681996;
        dVar17 = cbrt(9.869604401089358);
        dVar17 = dVar17 * dVar17 * 3.3019272488946267;
        dVar42 = dVar17 * 0.3;
        dVar23 = (dVar29 / dVar8) * local_160 * 1.5874010519681996;
        dVar14 = dVar23 + dVar42;
        dVar42 = dVar42 - dVar23;
        dVar37 = 0.0;
        if (bVar4 && dVar9 < 1.0) {
          dVar37 = dVar11 * 1.2599210498948732 * -0.046875 * dVar13 * local_138 *
                   local_148 *
                   (pdVar2[2] * dVar42 * (1.0 / dVar14) +
                   (1.0 / (dVar16 * 0.003840616724010807 + 1.0)) *
                   pdVar2[1] * local_158 * 0.003840616724010807 * dVar30 + *pdVar2);
          dVar37 = dVar37 + dVar37;
        }
        dVar13 = 1.0;
        if (1.0 <= dVar9) {
          dVar13 = p->zeta_threshold;
        }
        uVar7 = -(ulong)(1.0 <= dVar9);
        dVar12 = (double)((ulong)(1.0 / dVar12) & uVar7 | ~uVar7 & 0x3ff0000000000000);
        dVar11 = dVar11 * dVar28;
        dVar38 = dVar11 * 1.2599210498948732 * dVar12;
        dVar18 = SQRT(dVar38);
        dVar19 = dVar18;
        if (dVar38 < 0.0) {
          dVar19 = sqrt(dVar38);
          dVar18 = sqrt(dVar38);
        }
        dVar18 = dVar18 * dVar38;
        dVar29 = dVar10 * dVar10 * 2.080083823051904 * 1.5874010519681996 * dVar29;
        dVar24 = dVar29 * 1.5874010519681996 * dVar12 * dVar12;
        dVar12 = log(16.081979498692537 /
                     (dVar24 * 0.123235 + dVar18 * 0.204775 + dVar19 * 3.79785 + dVar38 * 0.8969) +
                     1.0);
        dVar10 = p->zeta_threshold;
        dVar20 = log(32.16395899738507 /
                     (dVar24 * 0.1562925 + dVar18 * 0.420775 + dVar19 * 7.05945 + dVar38 * 1.549425)
                     + 1.0);
        dVar19 = log(29.608749977793437 /
                     (dVar24 * 0.1241775 + dVar18 * 0.1100325 + dVar19 * 5.1785 + dVar38 * 0.905775)
                     + 1.0);
        dVar18 = 0.0;
        if (bVar4 && dVar9 < 1.0) {
          dVar19 = (dVar38 * 0.0278125 + 1.0) * dVar19;
          dVar12 = (dVar38 * 0.053425 + 1.0) * 0.0621814 * dVar12;
          dVar9 = (local_138 + (double)(-(ulong)(0.0 <= dVar10) & (ulong)dVar22) + -2.0) *
                  1.9236610509315362;
          dVar18 = dVar13 * (dVar9 * 0.0197516734986138 * dVar19 +
                            ((dVar19 * -0.0197516734986138 +
                             (dVar38 * 0.05137 + 1.0) * -0.0310907 * dVar20 + dVar12) * dVar9 -
                            dVar12)) * 0.5;
        }
        dVar9 = pdVar2[3];
        dVar10 = pdVar2[4];
        dVar25 = dVar42 * dVar42;
        dVar12 = pdVar2[5];
        dVar20 = local_158 * local_158;
        dVar20 = dVar20 * dVar20 * dVar20;
        dVar13 = pdVar2[6];
        dVar19 = pdVar2[7];
        dVar24 = SQRT(dVar11);
        dVar38 = dVar24;
        if (dVar11 < 0.0) {
          dVar38 = sqrt(dVar11);
        }
        if (dVar11 < 0.0) {
          dVar24 = sqrt(dVar11);
        }
        dVar21 = log(16.081979498692537 /
                     (dVar29 * 0.123235 +
                     dVar24 * dVar11 * 0.204775 + dVar38 * 3.79785 + dVar11 * 0.8969) + 1.0);
        dVar32 = (double)(~uVar7 & 0x3ff0000000000000 | uVar7 & (ulong)dVar22);
        dVar29 = log(29.608749977793437 /
                     (dVar29 * 0.1241775 +
                     dVar24 * dVar11 * 0.1100325 + dVar38 * 5.1785 + dVar11 * 0.905775) + 1.0);
        dVar23 = dVar23 * dVar17 * 0.6;
        dVar33 = local_160 * local_160 * 1.2599210498948732 * 4.0 * (dVar28 / (dVar8 * dVar15));
        dVar24 = dVar23 - dVar33;
        dVar24 = dVar24 * dVar24;
        dVar8 = pdVar2[9];
        dVar28 = dVar24 * dVar24 * dVar24;
        dVar17 = pdVar2[10];
        dVar22 = pdVar2[0xb];
        dVar38 = cbrt(dVar16);
        pdVar3 = out->zk;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          dVar31 = dVar14 * dVar14;
          dVar43 = dVar16 * 0.46914023462026644 + 1.0;
          dVar16 = dVar43 * dVar43;
          dVar15 = dVar15 * dVar15 * dVar15 * dVar15;
          dVar34 = 1.0 / (dVar15 * dVar15);
          dVar16 = (1.0 / (dVar16 * dVar16)) / dVar16;
          dVar33 = dVar33 + dVar23;
          dVar33 = dVar33 * dVar33;
          dVar15 = (1.0 / (dVar33 * dVar33)) / dVar33;
          lVar5 = (long)(p->dim).zk * sVar6;
          pdVar3[lVar5] =
               (dVar8 * dVar24 * (1.0 / dVar33) + dVar15 * dVar17 * dVar28 +
                dVar28 * dVar22 * dVar15 * dVar38 + dVar38 * (1.0 / dVar33) * dVar24 * pdVar2[0xc] +
               pdVar2[8]) *
               (((dVar11 * 0.053425 + 1.0) * -0.0621814 * dVar21 +
                (dVar11 * 0.0278125 + 1.0) *
                (dVar32 + dVar32 + -2.0) * 1.9236610509315362 * 0.0197516734986138 * dVar29) -
               (dVar18 + dVar18)) +
               dVar37 + (dVar20 * (1.0 / (dVar31 * dVar31)) * dVar25 * dVar25 * dVar19 *
                                  0.17058312527037534 * dVar34 * dVar16 +
                        dVar13 * dVar20 * 0.17058312527037534 * dVar34 * dVar16 +
                        (1.0 / dVar14) * dVar10 * dVar42 +
                        dVar30 * dVar9 * local_158 * 0.46914023462026644 * (1.0 / dVar43) +
                        dVar12 * dVar25 * (1.0 / dVar31)) * (dVar18 + dVar18) + pdVar3[lVar5];
        }
      }
      sVar6 = sVar6 + 1;
    } while (np != sVar6);
  }
  return;
}

Assistant:

static void
WORK_MGGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np,
 const double *rho, const double *sigma, const double *lapl, const double *tau,
 xc_mgga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  //feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW);
#endif

  size_t ip;
  double dens;
  double my_rho[2]={0.0, 0.0};
  double my_sigma[3]={0.0, 0.0, 0.0};
  double my_tau[2]={0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;

    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));

    /* Many functionals shamelessly divide by tau, so we set a reasonable threshold */
    /* skip all checks on tau for the kinetic functionals */
    if(p->info->flags & XC_FLAGS_NEEDS_TAU){
      my_tau[0] = m_max(p->tau_threshold, VAR(tau, ip, 0));
      if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
        /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
        my_sigma[0] = m_min(my_sigma[0], 8.0*my_rho[0]*my_tau[0]);
      }
    }
    /* lapl can have any values */

    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      if(p->info->flags & XC_FLAGS_NEEDS_TAU){
        my_tau[1] = m_max(p->tau_threshold, VAR(tau, ip, 1));
        if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
          /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
          my_sigma[2] = m_min(my_sigma[2], 8.0*my_rho[1]*my_tau[1]);
        }
      }
      
      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, &VAR(lapl, ip, 0), my_tau, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
          for(ii=0; ii < dim->vlapl; ii++)
            is_OK = is_OK && isfinite(out->VAR(vlapl, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_TAU)
          for(ii=0; ii < dim->vtau; ii++)
            is_OK = is_OK && isfinite(out->VAR(vtau, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0), VAR(tau, ip, 0));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0));
          else
            printf("%le 0.0 %le 0.0 0.0 0.0 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(tau, ip, 0));
        }else{
          printf("./xc-get_data %d 2 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le %le %le %le %le %le %le %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le %le %le %le %le %le %le 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1));
          else
            printf("%le %le %le %le %le 0.0 0.0 %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}